

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::ConsoleReporter::ConsoleReporter(ConsoleReporter *this,ReporterConfig *config)

{
  TablePrinter *this_00;
  ostream *os;
  anon_class_8_1_50637480 local_48;
  vector<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
  local_40;
  ReporterConfig *local_18;
  ReporterConfig *config_local;
  ConsoleReporter *this_local;
  
  local_18 = config;
  config_local = (ReporterConfig *)this;
  StreamingReporterBase<Catch::ConsoleReporter>::StreamingReporterBase
            (&this->super_StreamingReporterBase<Catch::ConsoleReporter>,config);
  (this->super_StreamingReporterBase<Catch::ConsoleReporter>).super_IStreamingReporter.
  _vptr_IStreamingReporter = (_func_int **)&PTR__ConsoleReporter_0024e508;
  this_00 = (TablePrinter *)operator_new(0x1a0);
  os = ReporterConfig::stream(local_18);
  local_48.config = local_18;
  ConsoleReporter::anon_class_8_1_50637480::operator()(&local_40,&local_48);
  TablePrinter::TablePrinter(this_00,os,&local_40);
  std::unique_ptr<Catch::TablePrinter,std::default_delete<Catch::TablePrinter>>::
  unique_ptr<std::default_delete<Catch::TablePrinter>,void>
            ((unique_ptr<Catch::TablePrinter,std::default_delete<Catch::TablePrinter>> *)
             &this->m_tablePrinter,this_00);
  clara::std::
  vector<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
  ::~vector(&local_40);
  this->m_headerPrinted = false;
  return;
}

Assistant:

ConsoleReporter::ConsoleReporter(ReporterConfig const& config)
    : StreamingReporterBase(config),
    m_tablePrinter(new TablePrinter(config.stream(),
        [&config]() -> std::vector<ColumnInfo> {
        if (config.fullConfig()->benchmarkNoAnalysis())
        {
            return{
                { "benchmark name", CATCH_CONFIG_CONSOLE_WIDTH - 43, ColumnInfo::Left },
                { "     samples", 14, ColumnInfo::Right },
                { "  iterations", 14, ColumnInfo::Right },
                { "        mean", 14, ColumnInfo::Right }
            };
        }
        else
        {
            return{
                { "benchmark name", CATCH_CONFIG_CONSOLE_WIDTH - 43, ColumnInfo::Left },
                { "samples      mean       std dev", 14, ColumnInfo::Right },
                { "iterations   low mean   low std dev", 14, ColumnInfo::Right },
                { "estimated    high mean  high std dev", 14, ColumnInfo::Right }
            };
        }
    }())) {}